

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::Model::AppendBody
          (Model *this,SpatialTransform *joint_frame,Joint *joint,Body *body,string *body_name)

{
  uint uVar1;
  string *in_R8;
  string *in_stack_00000e80;
  Body *in_stack_00000e88;
  Joint *in_stack_00000e90;
  SpatialTransform *in_stack_00000e98;
  uint in_stack_00000ea4;
  Model *in_stack_00000ea8;
  string local_48 [72];
  
  std::__cxx11::string::string(local_48,in_R8);
  uVar1 = AddBody(in_stack_00000ea8,in_stack_00000ea4,in_stack_00000e98,in_stack_00000e90,
                  in_stack_00000e88,in_stack_00000e80);
  std::__cxx11::string::~string(local_48);
  return uVar1;
}

Assistant:

unsigned int Model::AppendBody (
  const Math::SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  return Model::AddBody (previously_added_body_id,
                         joint_frame,
                         joint,
                         body,
                         body_name);
}